

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_binary_ptr_op
          (CompilerMSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool bVar1;
  bool local_9d;
  undefined1 local_90 [32];
  undefined1 local_70 [71];
  bool local_29;
  char *pcStack_28;
  bool forward;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerMSL *this_local;
  
  pcStack_28 = op;
  op_local._0_4_ = op1;
  op_local._4_4_ = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,op0);
  local_9d = false;
  if (bVar1) {
    local_9d = CompilerGLSL::should_forward(&this->super_CompilerGLSL,(uint32_t)op_local);
  }
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  local_29 = local_9d;
  to_ptr_expression_abi_cxx11_((CompilerMSL *)local_70,(uint32_t)this,SUB41(op_local._4_4_,0));
  to_ptr_expression_abi_cxx11_((CompilerMSL *)local_90,(uint32_t)this,SUB41((uint32_t)op_local,0));
  join<std::__cxx11::string,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string>
            ((spirv_cross *)(local_70 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
             (char (*) [2])0x40c6cb,&stack0xffffffffffffffd8,(char (*) [2])0x40c6cb,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  CompilerGLSL::emit_op
            (&this->super_CompilerGLSL,result_type_00,result_id_00,(string *)(local_70 + 0x20),
             (bool)(local_29 & 1),false);
  ::std::__cxx11::string::~string((string *)(local_70 + 0x20));
  ::std::__cxx11::string::~string((string *)local_90);
  ::std::__cxx11::string::~string((string *)local_70);
  Compiler::inherit_expression_dependencies((Compiler *)this,op1_local,op_local._4_4_);
  Compiler::inherit_expression_dependencies((Compiler *)this,op1_local,(uint32_t)op_local);
  return;
}

Assistant:

void CompilerMSL::emit_binary_ptr_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1, const char *op)
{
	bool forward = should_forward(op0) && should_forward(op1);
	emit_op(result_type, result_id, join(to_ptr_expression(op0), " ", op, " ", to_ptr_expression(op1)), forward);
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}